

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorFactory.cpp
# Opt level: O3

shared_ptr<adios2::core::Operator> __thiscall
adios2::core::MakeOperator(core *this,string *type,Params *parameters)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  shared_ptr<adios2::core::Operator> sVar6;
  string typeLowerCase;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  helper::LowerCase<std::__cxx11::string>(&local_d0,(helper *)type,(string *)parameters);
  iVar1 = std::__cxx11::string::compare((char *)&local_d0);
  if (((((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 == 0)) ||
       (iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 == 0)) ||
      ((iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 == 0 ||
       (iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 == 0)))) ||
     (iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 == 0)) goto LAB_003f373f;
  iVar1 = std::__cxx11::string::compare((char *)&local_d0);
  if (iVar1 == 0) {
    local_f0._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<adios2::core::compress::CompressPNG,std::allocator<adios2::core::compress::CompressPNG>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length,
               (CompressPNG **)&local_f0,(allocator<adios2::core::compress::CompressPNG> *)&local_b0
               ,parameters);
    _Var5._M_pi = extraout_RDX;
LAB_003f3645:
    *(pointer *)this = local_f0._M_dataplus._M_p;
    *(size_type *)(this + 8) = local_f0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_003f3892;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar1 == 0) {
      local_f0._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<adios2::core::compress::CompressSirius,std::allocator<adios2::core::compress::CompressSirius>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length,
                 (CompressSirius **)&local_f0,
                 (allocator<adios2::core::compress::CompressSirius> *)&local_b0,parameters);
      _Var5._M_pi = extraout_RDX_00;
      goto LAB_003f3645;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_d0);
    if (((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 != 0)) &&
       (iVar1 = std::__cxx11::string::compare((char *)&local_d0), iVar1 != 0)) {
      iVar1 = std::__cxx11::string::compare((char *)&local_d0);
      if (iVar1 == 0) {
        local_f0._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<adios2::plugin::PluginOperator,std::allocator<adios2::plugin::PluginOperator>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length,
                   (PluginOperator **)&local_f0,
                   (allocator<adios2::plugin::PluginOperator> *)&local_b0,parameters);
        _Var5._M_pi = extraout_RDX_01;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar1 != 0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Operator","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"OperatorFactory","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MakeOperator","");
          std::operator+(&local_50,"ADIOS2 does not support ",&local_d0);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar4 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar4) {
            local_90.field_2._M_allocated_capacity = *psVar4;
            local_90.field_2._8_8_ = plVar2[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar4;
            local_90._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_90._M_string_length = plVar2[1];
          *plVar2 = (long)psVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          helper::Throw<std::invalid_argument>(&local_f0,&local_b0,&local_70,&local_90,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          goto LAB_003f373f;
        }
        local_f0._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<adios2::core::compress::CompressNull,std::allocator<adios2::core::compress::CompressNull>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length,
                   (CompressNull **)&local_f0,
                   (allocator<adios2::core::compress::CompressNull> *)&local_b0,parameters);
        _Var5._M_pi = extraout_RDX_02;
      }
      goto LAB_003f3645;
    }
  }
LAB_003f373f:
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Operator","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"OperatorFactory","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MakeOperator","");
  std::operator+(&local_50,"ADIOS2 didn\'t compile with ",&local_d0);
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  psVar4 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90.field_2._8_8_ = puVar3[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_90._M_string_length = puVar3[1];
  *puVar3 = psVar4;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  helper::Throw<std::invalid_argument>(&local_f0,&local_b0,&local_70,&local_90,-1);
  _Var5._M_pi = extraout_RDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_05;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_08;
  }
LAB_003f3892:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_09;
  }
  sVar6.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<adios2::core::Operator>)
         sVar6.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Operator> MakeOperator(const std::string &type, const Params &parameters)
{
    std::shared_ptr<Operator> ret = nullptr;

    const std::string typeLowerCase = helper::LowerCase(type);

    if (typeLowerCase == "bigwhoop")
    {
#ifdef ADIOS2_HAVE_BIGWHOOP
        ret = std::make_shared<compress::CompressBigWhoop>(parameters);
#endif
    }
    else if (typeLowerCase == "blosc")
    {
#ifdef ADIOS2_HAVE_BLOSC2
        ret = std::make_shared<compress::CompressBlosc>(parameters);
#endif
    }
    else if (typeLowerCase == "bzip2")
    {
#ifdef ADIOS2_HAVE_BZIP2
        ret = std::make_shared<compress::CompressBZIP2>(parameters);
#endif
    }
    else if (typeLowerCase == "libpressio")
    {
#ifdef ADIOS2_HAVE_LIBPRESSIO
        ret = std::make_shared<compress::CompressLibPressio>(parameters);
#endif
    }
    else if (typeLowerCase == "mgard")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARD>(parameters);
#endif
    }
    else if (typeLowerCase == "mgardplus")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARDPlus>(parameters);
#endif
    }
    else if (typeLowerCase == "png")
    {
#ifdef ADIOS2_HAVE_PNG
        ret = std::make_shared<compress::CompressPNG>(parameters);
#endif
    }
    else if (typeLowerCase == "sirius")
    {
#ifdef ADIOS2_HAVE_MHS
        ret = std::make_shared<compress::CompressSirius>(parameters);
#endif
    }
    else if (typeLowerCase == "sz")
    {
#ifdef ADIOS2_HAVE_SZ
        ret = std::make_shared<compress::CompressSZ>(parameters);
#endif
    }
    else if (typeLowerCase == "zfp")
    {
#ifdef ADIOS2_HAVE_ZFP
        ret = std::make_shared<compress::CompressZFP>(parameters);
#endif
    }
    else if (typeLowerCase == "mdr")
    {
#ifdef ADIOS2_HAVE_MGARD_MDR
        ret = std::make_shared<refactor::RefactorMDR>(parameters);
#endif
    }
    else if (typeLowerCase == "plugin")
    {
        ret = std::make_shared<plugin::PluginOperator>(parameters);
    }
    else if (typeLowerCase == "null")
    {
        ret = std::make_shared<compress::CompressNull>(parameters);
    }
    else
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 does not support " + typeLowerCase +
                                                 " operation");
    }

    if (ret == nullptr)
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 didn't compile with " + typeLowerCase +
                                                 " library, operator not added");
    }

    return ret;
}